

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O3

int Parser_skipMisc(Parser *xmlParser)

{
  char **pstrSrc;
  char cVar1;
  char *__s1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  pstrSrc = &xmlParser->curPtr;
  do {
    __s1 = *pstrSrc;
    iVar2 = strncasecmp(__s1,"<!--",4);
    if (iVar2 == 0) {
      iVar2 = Parser_skipComment(pstrSrc);
    }
    else {
      iVar2 = strncasecmp(__s1,"<?xml ",6);
      iVar3 = 0xc;
      if ((iVar2 == 0) || (iVar2 = strncasecmp(__s1,"<?xml?",6), iVar2 == 0)) {
LAB_00106816:
        Parser_skipWhiteSpaces(xmlParser);
        return iVar3;
      }
      iVar2 = strncasecmp(__s1,"<?",2);
      if (iVar2 != 0) {
        iVar3 = 0;
        goto LAB_00106816;
      }
      if (__s1 == (char *)0x0) {
        iVar3 = 0x6a;
        goto LAB_00106816;
      }
      cVar1 = *__s1;
      while( true ) {
        if (cVar1 == '\0') goto LAB_00106816;
        pcVar4 = __s1 + 1;
        if ((cVar1 == '?') && (*pcVar4 == '>')) break;
        *pstrSrc = pcVar4;
        cVar1 = *pcVar4;
        __s1 = pcVar4;
      }
      *pstrSrc = __s1 + 2;
      iVar2 = 0;
    }
    Parser_skipWhiteSpaces(xmlParser);
    if (iVar2 != 0) {
      return iVar2;
    }
  } while( true );
}

Assistant:

static int Parser_skipMisc(
	/*! [in] The XML parser. */
	Parser *xmlParser)
{
	int rc = IXML_SUCCESS;
	int done = 0;

	while ((done == 0) && (rc == IXML_SUCCESS)) {
		if (strncasecmp(xmlParser->curPtr,
			    BEGIN_COMMENT,
			    strlen(BEGIN_COMMENT)) == 0) {
			/* <!-- */
			rc = Parser_skipComment(&(xmlParser->curPtr));

		} else if (strncasecmp(xmlParser->curPtr,
				   XMLDECL,
				   strlen(XMLDECL)) == 0 ||
			   strncasecmp(xmlParser->curPtr,
				   XMLDECL2,
				   strlen(XMLDECL2)) == 0) {
			/* <?xml or <?xml? */
			rc = IXML_SYNTAX_ERR;
		} else if (strncasecmp(xmlParser->curPtr,
				   BEGIN_PI,
				   strlen(BEGIN_PI)) == 0) {
			/* <? */
			rc = Parser_skipString(&xmlParser->curPtr, END_PI);
		} else {
			done = 1;
		}
		Parser_skipWhiteSpaces(xmlParser);
	}

	return rc;
}